

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O2

int ffpcln(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **array,void **nulval,int *status)

{
  uint uVar1;
  fitsfile *fptr_00;
  int *piVar2;
  long *__ptr;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int typecode;
  ulong local_8c8;
  fitsfile *local_8c0;
  int *local_8b8;
  long nrowbuf;
  LONGLONG width;
  LONGLONG ntotrows;
  LONGLONG repeat;
  size_t sizes [255];
  
  local_8b8 = colnum;
  memset(sizes,0,0x7f8);
  piVar2 = local_8b8;
  sizes[0xe] = 1;
  sizes[0xc] = 1;
  sizes[0xb] = 1;
  sizes[0x15] = 2;
  sizes[0x14] = 2;
  sizes[0x1e] = 4;
  sizes[0x1f] = 4;
  sizes[0x28] = 8;
  sizes[0x29] = 8;
  sizes[0x50] = 8;
  sizes[0x51] = 8;
  sizes[0x2a] = 4;
  sizes[0x52] = 8;
  sizes[0xa3] = 0x10;
  if (0 < *status) {
    return *status;
  }
  if (ncols < 1) {
    *status = 0;
    return 0;
  }
  local_8c8 = (ulong)(uint)ncols;
  local_8c0 = fptr;
  __ptr = (long *)malloc(local_8c8 * 8);
  fptr_00 = local_8c0;
  if (__ptr == (long *)0x0) {
    *status = 0x71;
    return 0x71;
  }
  ffgnrwll(local_8c0,&ntotrows,status);
  ffgrsz(fptr_00,&nrowbuf,status);
  uVar1 = 1000;
  if ((uint)ncols < 1000) {
    uVar1 = ncols;
  }
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      iVar8 = *status;
      if (iVar8 == 0) {
        if (ncols == 1) {
          ffpcn(fptr_00,*datatype,*piVar2,firstrow,1,nrows * *__ptr,*array,*nulval,status);
          free(__ptr);
          return *status;
        }
        local_8c8 = local_8c8 << 2;
        lVar7 = 0;
        goto LAB_0018c33f;
      }
      break;
    }
    ffgtclll(fptr_00,piVar2[uVar4],&typecode,&repeat,&width,status);
    __ptr[uVar4] = repeat;
    iVar8 = datatype[uVar4];
    if ((((long)iVar8 == 1) || (iVar8 == 0x10)) || (sizes[iVar8] == 0)) {
      ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
      *status = 0x19a;
    }
    if (typecode < 0) {
      ffpmsg("Cannot write to variable-length data (ffpcln)");
      *status = 0x140;
      iVar8 = 0x140;
      break;
    }
    iVar8 = *status;
    uVar4 = uVar4 + 1;
  } while (iVar8 == 0);
LAB_0018c322:
  free(__ptr);
  return iVar8;
LAB_0018c33f:
  lVar3 = nrows - lVar7;
  if (lVar3 == 0 || nrows < lVar7) goto LAB_0018c421;
  lVar5 = nrowbuf;
  if (lVar3 < nrowbuf) {
    lVar5 = lVar3;
  }
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if (local_8c8 == uVar6) goto LAB_0018c411;
    lVar3 = *(long *)((long)__ptr + uVar6 * 2);
    ffpcn(local_8c0,*(int *)((long)datatype + uVar6),*(int *)((long)piVar2 + uVar6),lVar7 + 1,1,
          lVar3 * lVar5,
          (void *)(lVar3 * lVar7 * sizes[*(int *)((long)datatype + uVar6)] +
                  *(long *)((long)array + uVar6 * 2)),*(void **)((long)nulval + uVar6 * 2),status);
    uVar4 = uVar6 + 4;
  } while (*status == 0);
  sprintf((char *)&repeat,"Failed to write column %d data rows %lld-%lld (ffpcln)",
          (ulong)*(uint *)((long)piVar2 + uVar6),firstrow,firstrow + lVar5 + -1);
  ffpmsg((char *)&repeat);
  iVar8 = *status;
  if (iVar8 != 0) goto LAB_0018c322;
LAB_0018c411:
  lVar7 = lVar7 + lVar5;
  firstrow = firstrow + lVar5;
  goto LAB_0018c33f;
LAB_0018c421:
  iVar8 = 0;
  goto LAB_0018c322;
}

Assistant:

int ffpcln( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to write              */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to write (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)    */
            LONGLONG nrows,       /* I - number of rows to write             */
            void **array,     /* I - array of pointers to values to write    */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            int  *status)     /* IO - error status                           */
/*
  Write arrays of values to NCOLS table columns. This is an optimization
  to write all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
  Undefined elements for column i that are equal to *(nulval[i]) are set to
  the defined null value, unless nulval[i]=0,
  in which case no checking for undefined values will be performed.
*/
{
    LONGLONG ntotrows, ndone, nwrite, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot write to variable-length data (ffpcln)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_write_colnull(fptr, datatype[0], colnum[0], firstrow, 1,
			 nrows*repeats[0], 
			 array[0], nulval[0], status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nwrite = (nrows-ndone);
      if (nwrite > nrowbuf) nwrite = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nwrite*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_write_colnull(fptr, datatype[icol], colnum[icol], ndone+1, 1, 
			   nelem1, array1, nulval[icol], status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg,
		  "Failed to write column %d data rows %lld-%lld (ffpcln)",
		  colnum[icol], currow, currow+nwrite-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nwrite;
      ndone += nwrite;
    }

    free(repeats);
    return *status;
}